

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

void __thiscall
ktx::OutputStream::writeKTX2(OutputStream *this,ktxTexture *texture,Reporter *report)

{
  ktx_error_code_e kVar1;
  char *local_90;
  undefined8 local_88;
  char local_80 [8];
  undefined8 uStack_78;
  char *local_70;
  undefined8 local_68;
  char local_60 [8];
  undefined8 uStack_58;
  char *local_50;
  path local_48;
  
  kVar1 = (*texture->vtbl->WriteToStdioStream)(texture,this->file);
  if (kVar1 != KTX_SUCCESS) {
    if (this->file != _stdout) {
      std::__cxx11::string::string((string *)&local_90,(string *)this);
      local_68 = local_88;
      if (local_90 == local_80) {
        uStack_58 = uStack_78;
        local_90 = local_60;
      }
      local_88 = 0;
      local_80[0] = '\0';
      local_70 = local_90;
      local_90 = local_80;
      local_50 = local_70;
      std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                (&local_48,&local_50,auto_format);
      std::filesystem::remove(&local_48);
      std::filesystem::__cxx11::path::~path(&local_48);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
    }
    local_48._M_pathname._M_dataplus._M_p = (pointer)ktxErrorString(kVar1);
    Reporter::fatal<char_const(&)[46],std::__cxx11::string&,char_const*>
              (report,IO_FAILURE,(char (*) [46])"Failed to write KTX file \"{}\": KTX error: {}.",
               &this->filepath,(char **)&local_48);
  }
  return;
}

Assistant:

void OutputStream::writeKTX2(ktxTexture* texture, Reporter& report) {
    const auto ret = ktxTexture_WriteToStdioStream(texture, file);
    if (KTX_SUCCESS != ret) {
        if (file != stdout)
            std::filesystem::remove(DecodeUTF8Path(filepath).c_str());
        report.fatal(rc::IO_FAILURE, "Failed to write KTX file \"{}\": KTX error: {}.", filepath, ktxErrorString(ret));
    }

    // TODO: Investigate and resolve the portability issue with the C++ streams. The issue will most likely
    //       be in StreambufStream's position reporting and seeking. Currently a fallback is implemented in C above.
    // StreambufStream<std::streambuf*> stream(activeStream->rdbuf(), std::ios::in | std::ios::binary);
    // const auto ret = ktxTexture_WriteToStream(texture, stream.stream());
    //
    // if (KTX_SUCCESS != ret) {
    //     if (activeStream != &std::cout)
    //         std::filesystem::remove(DecodeUTF8Path(filepath).c_str());
    //     report.fatal(rc::IO_FAILURE, "Failed to write KTX file \"{}\": {}.", fmtOutFile(filepath), ktxErrorString(ret));
    // }
}